

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int32_t icu_63::getSamplesFromString
                  (UnicodeString *samples,double *dest,int32_t destCapacity,UErrorCode *status)

{
  bool bVar1;
  UObject UVar2;
  UObject d;
  int iVar3;
  UBool UVar4;
  int32_t iVar5;
  double dVar6;
  double dVar7;
  double sampleValue_1;
  double n;
  double t;
  double scale;
  double rangeHi;
  double rangeLo;
  undefined1 local_1a0 [8];
  FixedDecimal fixedHi;
  undefined1 local_120 [8];
  FixedDecimal fixedLo;
  double sampleValue;
  FixedDecimal fixed;
  undefined1 local_80 [4];
  int32_t tildeIndex;
  UnicodeString *local_40;
  UnicodeString *sampleRange;
  int local_30;
  int32_t sampleEndIdx;
  int32_t sampleStartIdx;
  int32_t sampleCount;
  UErrorCode *status_local;
  double *pdStack_18;
  int32_t destCapacity_local;
  double *dest_local;
  UnicodeString *samples_local;
  
  local_30 = 0;
  sampleRange._4_4_ = 0;
  sampleEndIdx = 0;
  _sampleStartIdx = status;
  status_local._4_4_ = destCapacity;
  pdStack_18 = dest;
  dest_local = (double *)samples;
  do {
    iVar3 = local_30;
    bVar1 = false;
    if (sampleEndIdx < status_local._4_4_) {
      iVar5 = UnicodeString::length((UnicodeString *)dest_local);
      bVar1 = iVar3 < iVar5;
    }
    if (!bVar1) {
      return sampleEndIdx;
    }
    sampleRange._4_4_ = UnicodeString::indexOf((UnicodeString *)dest_local,L',',local_30);
    if (sampleRange._4_4_ == -1) {
      sampleRange._4_4_ = UnicodeString::length((UnicodeString *)dest_local);
    }
    UnicodeString::tempSubStringBetween
              ((UnicodeString *)local_80,(UnicodeString *)dest_local,local_30,sampleRange._4_4_);
    local_40 = (UnicodeString *)local_80;
    iVar5 = UnicodeString::indexOf((UnicodeString *)local_80,L'~');
    if (iVar5 < 0) {
      FixedDecimal::FixedDecimal((FixedDecimal *)&sampleValue,local_40,_sampleStartIdx);
      UVar2 = fixed.super_UObject;
      fixedLo._56_8_ = fixed.super_UObject._vptr_UObject;
      if (fixed.source._0_4_ == 0) {
LAB_002fb95f:
        pdStack_18[sampleEndIdx] = (double)fixedLo._56_8_;
        sampleEndIdx = sampleEndIdx + 1;
      }
      else {
        dVar6 = floor((double)fixed.super_UObject._vptr_UObject);
        if (((double)UVar2._vptr_UObject != dVar6) ||
           (NAN((double)UVar2._vptr_UObject) || NAN(dVar6))) goto LAB_002fb95f;
      }
      FixedDecimal::~FixedDecimal((FixedDecimal *)&sampleValue);
LAB_002fbcb5:
      local_30 = sampleRange._4_4_ + 1;
      bVar1 = false;
    }
    else {
      UnicodeString::tempSubStringBetween
                ((UnicodeString *)&fixedHi._hasIntegerValue,local_40,0,iVar5);
      FixedDecimal::FixedDecimal
                ((FixedDecimal *)local_120,(UnicodeString *)&fixedHi._hasIntegerValue,
                 _sampleStartIdx);
      UnicodeString::~UnicodeString((UnicodeString *)&fixedHi._hasIntegerValue);
      UnicodeString::tempSubStringBetween((UnicodeString *)&rangeLo,local_40,iVar5 + 1,0x7fffffff);
      FixedDecimal::FixedDecimal
                ((FixedDecimal *)local_1a0,(UnicodeString *)&rangeLo,_sampleStartIdx);
      UnicodeString::~UnicodeString((UnicodeString *)&rangeLo);
      d = fixedLo.super_UObject;
      UVar2 = fixedHi.super_UObject;
      UVar4 = ::U_FAILURE(*_sampleStartIdx);
      if (UVar4 == '\0') {
        if ((double)d._vptr_UObject <= (double)UVar2._vptr_UObject) {
          t = scaleForInt((double)d._vptr_UObject);
          dVar6 = scaleForInt((double)UVar2._vptr_UObject);
          if (t < dVar6) {
            t = dVar6;
          }
          for (sampleValue_1 = t * (double)d._vptr_UObject;
              sampleValue_1 <= t * (double)UVar2._vptr_UObject; sampleValue_1 = sampleValue_1 + 1.0)
          {
            dVar6 = sampleValue_1 / t;
            dVar7 = floor(dVar6);
            if (((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) || (fixedLo.source._0_4_ < 1)) {
              pdStack_18[sampleEndIdx] = dVar6;
              sampleEndIdx = sampleEndIdx + 1;
            }
            if (status_local._4_4_ <= sampleEndIdx) break;
          }
          bVar1 = false;
        }
        else {
          *_sampleStartIdx = U_INVALID_FORMAT_ERROR;
          bVar1 = true;
        }
      }
      else {
        bVar1 = true;
      }
      FixedDecimal::~FixedDecimal((FixedDecimal *)local_1a0);
      FixedDecimal::~FixedDecimal((FixedDecimal *)local_120);
      if (!bVar1) goto LAB_002fbcb5;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_80);
    if (bVar1) {
      return sampleEndIdx;
    }
  } while( true );
}

Assistant:

static int32_t
getSamplesFromString(const UnicodeString &samples, double *dest,
                        int32_t destCapacity, UErrorCode& status) {
    int32_t sampleCount = 0;
    int32_t sampleStartIdx = 0;
    int32_t sampleEndIdx = 0;

    //std::string ss;  // TODO: debugging.
    // std::cout << "PluralRules::getSamples(), samples = \"" << samples.toUTF8String(ss) << "\"\n";
    for (sampleCount = 0; sampleCount < destCapacity && sampleStartIdx < samples.length(); ) {
        sampleEndIdx = samples.indexOf(COMMA, sampleStartIdx);
        if (sampleEndIdx == -1) {
            sampleEndIdx = samples.length();
        }
        const UnicodeString &sampleRange = samples.tempSubStringBetween(sampleStartIdx, sampleEndIdx);
        // ss.erase();
        // std::cout << "PluralRules::getSamples(), samplesRange = \"" << sampleRange.toUTF8String(ss) << "\"\n";
        int32_t tildeIndex = sampleRange.indexOf(TILDE);
        if (tildeIndex < 0) {
            FixedDecimal fixed(sampleRange, status);
            double sampleValue = fixed.source;
            if (fixed.visibleDecimalDigitCount == 0 || sampleValue != floor(sampleValue)) {
                dest[sampleCount++] = sampleValue;
            }
        } else {

            FixedDecimal fixedLo(sampleRange.tempSubStringBetween(0, tildeIndex), status);
            FixedDecimal fixedHi(sampleRange.tempSubStringBetween(tildeIndex+1), status);
            double rangeLo = fixedLo.source;
            double rangeHi = fixedHi.source;
            if (U_FAILURE(status)) {
                break;
            }
            if (rangeHi < rangeLo) {
                status = U_INVALID_FORMAT_ERROR;
                break;
            }

            // For ranges of samples with fraction decimal digits, scale the number up so that we
            //   are adding one in the units place. Avoids roundoffs from repetitive adds of tenths.

            double scale = scaleForInt(rangeLo);
            double t = scaleForInt(rangeHi);
            if (t > scale) {
                scale = t;
            }
            rangeLo *= scale;
            rangeHi *= scale;
            for (double n=rangeLo; n<=rangeHi; n+=1) {
                // Hack Alert: don't return any decimal samples with integer values that
                //    originated from a format with trailing decimals.
                //    This API is returning doubles, which can't distinguish having displayed
                //    zeros to the right of the decimal.
                //    This results in test failures with values mapping back to a different keyword.
                double sampleValue = n/scale;
                if (!(sampleValue == floor(sampleValue) && fixedLo.visibleDecimalDigitCount > 0)) {
                    dest[sampleCount++] = sampleValue;
                }
                if (sampleCount >= destCapacity) {
                    break;
                }
            }
        }
        sampleStartIdx = sampleEndIdx + 1;
    }
    return sampleCount;
}